

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Pattern::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Pattern *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdPatternBitmapColor *pMVar1;
  MthdPatternShape *pMVar2;
  MthdBitmapFormat *pMVar3;
  MthdCtxFormat *pMVar4;
  MthdDmaNotify *pMVar5;
  MthdNotify *pMVar6;
  SingleMthdTest *pSVar7;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *this_01;
  result_type rVar8;
  MthdPmTrigger *this_02;
  MthdMissing *this_03;
  MthdPatternBitmap *pMVar9;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_275;
  allocator local_274;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  allocator local_270;
  allocator local_26f;
  allocator local_26e;
  allocator local_26d;
  allocator local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  MthdPatternBitmapColor *local_268;
  MthdPatternBitmapColor *local_260;
  MthdPatternShape *local_258;
  MthdBitmapFormat *local_250;
  MthdCtxFormat *local_248;
  MthdDmaNotify *local_240;
  MthdNotify *local_238;
  SingleMthdTest *local_230;
  MthdMissing *local_228;
  MthdPmTrigger *local_220;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  SingleMthdTest *local_90;
  MthdNotify *local_88;
  MthdPmTrigger *local_80;
  MthdDmaNotify *local_78;
  MthdMissing *local_70;
  MthdCtxFormat *local_68;
  MthdBitmapFormat *local_60;
  MthdPatternShape *local_58;
  MthdPatternBitmapColor *local_50;
  MthdPatternBitmapColor *local_48;
  MthdPatternBitmap *local_40;
  MthdPatternBitmap *local_38;
  
  local_230 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"nop",&local_269);
  pSVar7 = local_230;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_230,opt,(uint32_t)rVar8,&local_b0,-1,(this->super_Class).cls,0x100,1,4
            );
  local_90 = pSVar7;
  local_238 = (MthdNotify *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_218 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_d0,"notify",&local_26a);
  pMVar6 = local_238;
  MthdNotify::SingleMthdTest
            (local_238,opt,(uint32_t)rVar8,&local_d0,0,(this->super_Class).cls,0x104,1,4);
  local_88 = pMVar6;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_220 = this_02;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_f0,"pm_trigger",&local_26b);
  MthdPmTrigger::SingleMthdTest
            (this_02,opt,(uint32_t)rVar8,&local_f0,-1,(this->super_Class).cls,0x140,1,4);
  local_80 = this_02;
  local_240 = (MthdDmaNotify *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_110,"dma_notify",&local_26c);
  pMVar5 = local_240;
  MthdDmaNotify::SingleMthdTest
            (local_240,opt,(uint32_t)rVar8,&local_110,1,(this->super_Class).cls,0x180,1,4);
  local_78 = pMVar5;
  this_03 = (MthdMissing *)operator_new(0x25950);
  local_228 = this_03;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_130,"missing",&local_26d);
  MthdMissing::SingleMthdTest
            (this_03,opt,(uint32_t)rVar8,&local_130,-1,(this->super_Class).cls,0x200,1,4);
  local_70 = this_03;
  local_248 = (MthdCtxFormat *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_150,"format",&local_26e);
  pMVar4 = local_248;
  MthdCtxFormat::SingleMthdTest
            (local_248,opt,(uint32_t)rVar8,&local_150,2,(this->super_Class).cls,0x300,1,4);
  local_68 = pMVar4;
  local_250 = (MthdBitmapFormat *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_170,"bitmap_format",&local_26f);
  pMVar3 = local_250;
  MthdBitmapFormat::SingleMthdTest
            (local_250,opt,(uint32_t)rVar8,&local_170,3,(this->super_Class).cls,0x304,1,4);
  local_60 = pMVar3;
  local_258 = (MthdPatternShape *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_190,"pattern_shape",&local_270);
  pMVar2 = local_258;
  MthdPatternShape::SingleMthdTest
            (local_258,opt,(uint32_t)rVar8,&local_190,4,(this->super_Class).cls,0x308,1,4);
  local_58 = pMVar2;
  local_260 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b0,"pattern_bitmap_color_0",&local_271);
  pMVar1 = local_260;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_260,opt,(uint32_t)rVar8,&local_1b0,5,(this->super_Class).cls,0x310,0);
  local_50 = pMVar1;
  local_268 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  pMVar1 = local_268;
  std::__cxx11::string::string((string *)&local_1d0,"pattern_bitmap_color_1",&local_272);
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (pMVar1,opt,(uint32_t)rVar8,&local_1d0,6,(this->super_Class).cls,0x314,1);
  local_48 = pMVar1;
  pMVar9 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f0,"pattern_bitmap_0",&local_273);
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar9,opt,(uint32_t)rVar8,&local_1f0,7,(this->super_Class).cls,0x318,0);
  local_40 = pMVar9;
  pMVar9 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_210,"pattern_bitmap_1",&local_274);
  this_01 = local_218;
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar9,opt,(uint32_t)rVar8,&local_210,8,(this->super_Class).cls,0x31c,1);
  __l._M_len = 0xc;
  __l._M_array = &local_90;
  local_38 = pMVar9;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(this_01,__l,&local_275);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return this_01;
}

Assistant:

std::vector<SingleMthdTest *> Pattern::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdCtxFormat(opt, rnd(), "format", 2, cls, 0x300),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 3, cls, 0x304),
		new MthdPatternShape(opt, rnd(), "pattern_shape", 4, cls, 0x308),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_0", 5, cls, 0x310, 0),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_1", 6, cls, 0x314, 1),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_0", 7, cls, 0x318, 0),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_1", 8, cls, 0x31c, 1),
	};
}